

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataQueryPdu.cpp
# Opt level: O1

void __thiscall DIS::DataQueryPdu::DataQueryPdu(DataQueryPdu *this)

{
  SimulationManagementFamilyPdu::SimulationManagementFamilyPdu
            (&this->super_SimulationManagementFamilyPdu);
  (this->super_SimulationManagementFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__DataQueryPdu_001b3ef0;
  this->_requestID = 0;
  this->_timeInterval = 0;
  this->_numberOfFixedDatumRecords = 0;
  this->_numberOfVariableDatumRecords = 0;
  (this->_fixedDatums).super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_fixedDatums).super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_fixedDatums).super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_variableDatums).
  super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_variableDatums).
  super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_variableDatums).
  super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PduSuperclass::setPduType((PduSuperclass *)this,'\x12');
  return;
}

Assistant:

DataQueryPdu::DataQueryPdu() : SimulationManagementFamilyPdu(),
   _requestID(0), 
   _timeInterval(0), 
   _numberOfFixedDatumRecords(0), 
   _numberOfVariableDatumRecords(0)
{
    setPduType( 18 );
}